

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O2

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  ulong uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *__assertion;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  
  if (p->vTruths == (Vec_Int_t *)0x0) {
    iVar6 = ((p->nObjs >> 4) + 1) - (uint)((p->nObjs & 0xfU) == 0);
    p->nTtWords = iVar6;
    lVar15 = (long)iVar6 * ((long)pCex->iFrame + 1);
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar6 = (int)lVar15;
    iVar14 = 0x10;
    if (0xe < iVar6 - 1U) {
      iVar14 = iVar6;
    }
    pVVar3->nCap = iVar14;
    if (iVar14 == 0) {
      pVVar3->pArray = (int *)0x0;
      pVVar3->nSize = iVar6;
    }
    else {
      __s = (int *)malloc((long)iVar14 << 2);
      pVVar3->pArray = __s;
      pVVar3->nSize = iVar6;
      if (__s != (int *)0x0) {
        memset(__s,0,lVar15 * 4);
      }
    }
    p->vTruths = pVVar3;
    Gia_ManCleanMark0(p);
    iVar6 = 0;
    uVar7 = pCex->nRegs;
    while (iVar6 <= pCex->iFrame) {
      iVar14 = 0;
      while ((uVar16 = uVar7 + iVar14, iVar14 < p->vCis->nSize - p->nRegs &&
             (pGVar4 = Gia_ManCi(p,iVar14), pGVar4 != (Gia_Obj_t *)0x0))) {
        uVar13 = (&pCex[1].iPo)[(int)uVar16 >> 5];
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)((uint)((uVar13 >> (uVar16 & 0x1f) & 1) != 0) << 0x1e);
        if ((uVar13 >> (uVar16 & 0x1f) & 1) != 0) {
          Gia_ManAddTwo(p,iVar6,pGVar4,1);
        }
        iVar14 = iVar14 + 1;
      }
      iVar10 = 0;
      while ((iVar10 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar10), pGVar4 != (Gia_Obj_t *)0x0))) {
        uVar1 = *(ulong *)pGVar4;
        if (((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) &&
           (uVar13 = (uint)(uVar1 >> 0x20),
           uVar13 = (uVar13 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar13 & 0x1fffffff)) >> 0x1e) &
                    ((uint)(uVar1 >> 0x1d) & 7 ^ *(uint *)(pGVar4 + -(uVar1 & 0x1fffffff)) >> 0x1e)
                    & 1, *(ulong *)pGVar4 = uVar1 & 0xffffffff3fffffff | (ulong)(uVar13 << 0x1e),
           uVar13 != 0)) {
          Gia_ManAddTwo(p,iVar6,pGVar4,1);
        }
        iVar10 = iVar10 + 1;
      }
      iVar10 = 0;
      while ((iVar10 < p->vCos->nSize && (pGVar4 = Gia_ManCo(p,iVar10), pGVar4 != (Gia_Obj_t *)0x0))
            ) {
        uVar1 = *(ulong *)pGVar4;
        uVar12 = (uint)(uVar1 >> 0x1d) & 1;
        uVar13 = *(uint *)(pGVar4 + -(ulong)((uint)uVar1 & 0x1fffffff)) >> 0x1e & 1;
        *(ulong *)pGVar4 = uVar1 & 0xffffffffbfffffff | (ulong)((uVar13 ^ uVar12) << 0x1e);
        if (uVar13 != uVar12) {
          Gia_ManAddTwo(p,iVar6,pGVar4,1);
        }
        iVar10 = iVar10 + 1;
      }
      if (iVar6 == pCex->iFrame) {
        uVar7 = uVar7 + iVar14;
        break;
      }
      iVar6 = iVar6 + 1;
      iVar14 = 0;
      while (((uVar7 = uVar16, iVar14 < p->nRegs &&
              (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar14),
              pGVar4 != (Gia_Obj_t *)0x0)) &&
             (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar14), pGVar5 != (Gia_Obj_t *)0x0
             ))) {
        uVar7 = *(uint *)pGVar4 >> 0x1e & 1;
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)(uVar7 << 0x1e);
        if (uVar7 != 0) {
          Gia_ManAddTwo(p,iVar6,pGVar5,1);
        }
        iVar14 = iVar14 + 1;
      }
    }
    if (uVar7 == pCex->nBits) {
      pGVar4 = Gia_ManPo(p,pCex->iPo);
      uVar7 = *(uint *)pGVar4;
      if ((uVar7 >> 0x1e & 1) == 0) {
        puts("Counter-example is invalid.");
      }
      Gia_ManCleanMark0(p);
      pGVar4 = Gia_ManPo(p,pCex->iPo);
      pGVar4->field_0x3 = pGVar4->field_0x3 | 0x40;
      Gia_ManAddTwo(p,pCex->iFrame,pGVar4,2);
      iVar6 = pCex->iFrame;
      while (-1 < iVar6) {
        iVar14 = 0;
        while ((iVar14 < p->vCos->nSize &&
               (pGVar4 = Gia_ManCo(p,iVar14), pGVar4 != (Gia_Obj_t *)0x0))) {
          uVar1 = *(ulong *)pGVar4 >> 0x1e;
          uVar8 = (ulong)((uint)*(ulong *)pGVar4 & 0x1fffffff);
          *(ulong *)(pGVar4 + -uVar8) =
               *(ulong *)(pGVar4 + -uVar8) & 0xffffffffbfffffff | (ulong)(((uint)uVar1 & 1) << 0x1e)
          ;
          if ((uVar1 & 1) != 0) {
            uVar1 = *(ulong *)pGVar4;
            *(ulong *)pGVar4 = uVar1 & 0xffffffffbfffffff;
            Gia_ManAddTwo(p,iVar6,pGVar4 + -(ulong)((uint)uVar1 & 0x1fffffff),2);
          }
          iVar14 = iVar14 + 1;
        }
        iVar14 = p->nObjs;
        while (1 < iVar14) {
          iVar14 = iVar14 + -1;
          pGVar4 = Gia_ManObj(p,iVar14);
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar16 = (uint)*(ulong *)pGVar4;
          if ((uVar16 & 0xc0000000) == 0x40000000 && (~uVar16 & 0x1fffffff) != 0) {
            *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffff3fffffff;
            uVar13 = Gia_ManGetTwo(p,iVar6,pGVar4);
            uVar13 = uVar13 & 1;
            uVar12 = Gia_ManGetTwo(p,iVar6,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
            uVar17 = (uint)(*(ulong *)pGVar4 >> 0x1d) & 1;
            uVar11 = uVar17 ^ uVar12 & 1;
            uVar2 = Gia_ManGetTwo(p,iVar6,pGVar4 + -(*(ulong *)pGVar4 >> 0x20 & 0x1fffffff));
            uVar1 = *(ulong *)pGVar4;
            uVar16 = (uint)(uVar1 >> 0x20);
            uVar9 = uVar16 >> 0x1d & 1;
            if (uVar11 == (uVar9 ^ uVar2 & 1)) {
              if (uVar13 != uVar11) {
                __assert_fail("Value == (Value0 & Value1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                              ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
              }
              if (uVar13 == 0 && fJustMax == 0) goto LAB_00487e01;
              pGVar4[-(uVar1 >> 0x20 & 0x1fffffff)].field_0x3 =
                   pGVar4[-(uVar1 >> 0x20 & 0x1fffffff)].field_0x3 | 0x40;
              *(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) =
                   *(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) | 0x40000000;
              Gia_ManAddTwo(p,iVar6,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff),2);
LAB_00487e49:
              uVar16 = *(uint *)&pGVar4->field_0x4;
            }
            else {
              if ((uVar12 & 1) != uVar17) {
                if ((uVar2 & 1) != uVar9) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar13 != 0) {
                  __assert_fail("Value == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                pGVar4[-(ulong)(uVar16 & 0x1fffffff)].field_0x3 =
                     pGVar4[-(ulong)(uVar16 & 0x1fffffff)].field_0x3 | 0x40;
                goto LAB_00487e49;
              }
              if (uVar13 != 0) {
                __assert_fail("Value == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                              ,0x90,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
              }
LAB_00487e01:
              pGVar4[-(ulong)((uint)uVar1 & 0x1fffffff)].field_0x3 =
                   pGVar4[-(ulong)((uint)uVar1 & 0x1fffffff)].field_0x3 | 0x40;
              uVar16 = (uint)*(undefined8 *)pGVar4;
            }
            Gia_ManAddTwo(p,iVar6,pGVar4 + -(ulong)(uVar16 & 0x1fffffff),2);
          }
        }
        if (iVar6 == 0) break;
        iVar14 = 0;
        while ((iVar14 < p->vCis->nSize - p->nRegs &&
               (pGVar4 = Gia_ManCi(p,iVar14), pGVar4 != (Gia_Obj_t *)0x0))) {
          pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
          iVar14 = iVar14 + 1;
        }
        iVar6 = iVar6 + -1;
        iVar14 = 0;
        while (((iVar14 < p->nRegs &&
                (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar14),
                pGVar4 != (Gia_Obj_t *)0x0)) &&
               (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar14),
               pGVar5 != (Gia_Obj_t *)0x0))) {
          uVar16 = *(uint *)pGVar5 >> 0x1e & 1;
          *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)(uVar16 << 0x1e);
          if (uVar16 != 0) {
            pGVar5->field_0x3 = pGVar5->field_0x3 & 0xbf;
            Gia_ManAddTwo(p,iVar6,pGVar4,2);
          }
          iVar14 = iVar14 + 1;
        }
      }
      Gia_ManCleanMark0(p);
      return uVar7 >> 0x1e & 1;
    }
    __assertion = "iBit == pCex->nBits";
    uVar7 = 99;
  }
  else {
    __assertion = "p->vTruths == NULL";
    uVar7 = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                ,uVar7,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}